

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

bool __thiscall QSqlTableModel::selectRow(QSqlTableModel *this,int row)

{
  QString *this_00;
  undefined4 uVar1;
  long lVar2;
  QArrayData *pQVar3;
  undefined8 uVar4;
  QSqlTableModel *pQVar5;
  qsizetype qVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  QSqlDriver *pQVar12;
  ModifiedRow *pMVar13;
  Orientation row_00;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow> *this_01;
  QSqlRecord *this_02;
  uint uVar14;
  long in_FS_OFFSET;
  QSqlRecord curValues;
  QSqlRecord newValues;
  QSqlQuery q;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  QSqlRecord local_c0;
  QString local_b8;
  QString local_98;
  uint local_7c;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = row;
  if (-1 < row) {
    lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    local_58._forAlignment = -NAN;
    local_58._8_8_ = 0;
    local_58._16_8_ = (QSqlTableModel *)0x0;
    iVar10 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))();
    if (row < iVar10) {
      uVar1 = *(undefined4 *)(lVar2 + 0x230);
      *(undefined4 *)(lVar2 + 0x230) = 0xffffffff;
      local_98.d.d = *(Data **)(lVar2 + 0x2b0);
      local_98.d.ptr = *(char16_t **)(lVar2 + 0x2b8);
      local_98.d.size = *(qsizetype *)(lVar2 + 0x2c0);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar12 = QSqlDatabase::driver((QSqlDatabase *)(lVar2 + 0x228));
      row_00 = (Orientation)this;
      primaryValues((QSqlTableModel *)&local_78,row_00);
      (**(code **)(*(long *)pQVar12 + 0xa8))(&local_58,pQVar12,0,lVar2 + 0x298,&local_78,0);
      pQVar3 = *(QArrayData **)(lVar2 + 0x2b0);
      uVar4 = *(undefined8 *)(lVar2 + 0x2b8);
      *(PrivateShared **)(lVar2 + 0x2b0) = local_58.shared;
      *(undefined8 *)(lVar2 + 0x2b8) = local_58._8_8_;
      pQVar5 = *(QSqlTableModel **)(lVar2 + 0x2c0);
      *(undefined8 *)(lVar2 + 0x2c0) = local_58._16_8_;
      local_58.shared = (PrivateShared *)pQVar3;
      local_58._8_8_ = uVar4;
      local_58._16_8_ = pQVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      this_00 = (QString *)(lVar2 + 0x2b0);
      QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78.shared);
      if (selectRow(int)::wh == '\0') {
        selectRow();
      }
      cVar7 = QString::startsWith(this_00,0x151f20);
      if (cVar7 != '\0') {
        QString::remove((longlong)this_00,0);
      }
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_b8.d.size = 0;
      if (*(long *)(lVar2 + 0x2c0) != 0) {
        (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1f8))(&local_58,this);
        local_b8.d.d = (Data *)local_58.shared;
        local_b8.d.ptr = (char16_t *)local_58._8_8_;
        local_b8.d.size = local_58._16_8_;
      }
      qVar6 = local_b8.d.size;
      *(undefined4 *)(lVar2 + 0x230) = uVar1;
      QString::operator=(this_00,&local_98);
      if ((QSqlTableModel *)qVar6 == (QSqlTableModel *)0x0) {
        bVar8 = false;
      }
      else {
        local_c0.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
        QSqlRecord::QSqlRecord(&local_c0);
        local_78.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
        QSqlQuery::QSqlQuery((QSqlQuery *)&local_78.shared,(QSqlDatabase *)(lVar2 + 0x228));
        QSqlQuery::setForwardOnly((QSqlQuery *)&local_78.shared,true);
        bVar8 = QSqlQuery::exec((QSqlQuery *)&local_78.shared,&local_b8);
        if (bVar8) {
          bVar9 = QSqlQuery::next((QSqlQuery *)&local_78.shared);
          QSqlQuery::record((QSqlQuery *)&local_d8);
          local_58.shared = (PrivateShared *)local_c0.d.d.ptr;
          local_c0.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)local_d8.d.ptr;
          local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_58.shared);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_d8);
          QSqlQuery::~QSqlQuery((QSqlQuery *)&local_78.shared);
          this_01 = (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0);
          if (bVar9) {
            bVar9 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::contains
                              (this_01,(int *)&local_7c);
            if (!bVar9) {
              local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
              record((QSqlTableModel *)&local_d8,row_00);
              iVar10 = QSqlRecord::count((QSqlRecord *)&local_d8);
              iVar11 = QSqlRecord::count(&local_c0);
              if (iVar10 == iVar11) {
                iVar10 = QSqlRecord::count((QSqlRecord *)&local_d8);
                do {
                  if (iVar10 < 1) {
                    QSqlRecord::~QSqlRecord((QSqlRecord *)&local_d8);
                    goto LAB_00139d80;
                  }
                  iVar10 = iVar10 + -1;
                  QSqlRecord::value((QVariant *)&local_58,(QSqlRecord *)&local_d8,iVar10);
                  QSqlRecord::value((QVariant *)&local_78,&local_c0,iVar10);
                  cVar7 = QVariant::equals((QVariant *)&local_58);
                  QVariant::~QVariant((QVariant *)&local_78);
                  QVariant::~QVariant((QVariant *)&local_58);
                } while (cVar7 != '\0');
              }
              QSqlRecord::~QSqlRecord((QSqlRecord *)&local_d8);
            }
            pMVar13 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                                (this_01,(int *)&local_7c);
            pMVar13->m_submitted = true;
            pMVar13->m_op = Update;
            QSqlRecord::operator=(&pMVar13->m_db_values,&local_c0);
            this_02 = &pMVar13->m_rec;
            QSqlRecord::operator=(this_02,&local_c0);
            iVar10 = QSqlRecord::count(this_02);
            if (0 < iVar10) {
              uVar14 = iVar10 + 1;
              do {
                QSqlRecord::setGenerated(this_02,uVar14 - 2,false);
                uVar14 = uVar14 - 1;
              } while (1 < uVar14);
            }
          }
          else {
            pMVar13 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                                (this_01,(int *)&local_7c);
            pMVar13->m_submitted = true;
            pMVar13->m_op = Delete;
            QSqlRecord::clear(&pMVar13->m_rec);
            QSqlRecord::clear(&pMVar13->m_db_values);
          }
          QAbstractItemModel::headerDataChanged(row_00,2,local_7c);
          uVar14 = local_7c;
          local_58._4_4_ = 0;
          local_58._0_4_ = local_7c;
          local_58._8_8_ = 0;
          local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xffffffffffffffff;
          local_d0 = 0;
          uStack_c8 = 0;
          local_58._16_8_ = this;
          iVar10 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x80))(this);
          local_78._4_4_ = iVar10 + -1;
          local_78._0_4_ = uVar14;
          local_78._8_8_ = 0;
          local_78._16_8_ = this;
          QAbstractItemModel::dataChanged
                    ((QModelIndex *)this,(QModelIndex *)&local_58,(QList *)local_78.data);
        }
        else {
          QSqlQuery::~QSqlQuery((QSqlQuery *)&local_78.shared);
        }
LAB_00139d80:
        QSqlRecord::~QSqlRecord(&local_c0);
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00139a44;
    }
  }
  bVar8 = false;
LAB_00139a44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::selectRow(int row)
{
    Q_D(QSqlTableModel);

    if (row < 0 || row >= rowCount())
        return false;

    const int table_sort_col = d->sortColumn;
    d->sortColumn = -1;
    const QString table_filter = d->filter;
    d->filter = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                              d->tableName,
                                              primaryValues(row),
                                              false);
    static const QString wh = SqlTm::where() + SqlTm::sp();
    if (d->filter.startsWith(wh, Qt::CaseInsensitive))
        d->filter.remove(0, wh.size());

    QString stmt;

    if (!d->filter.isEmpty())
        stmt = selectStatement();

    d->sortColumn = table_sort_col;
    d->filter = table_filter;

    if (stmt.isEmpty())
        return false;

    bool exists;
    QSqlRecord newValues;

    {
        QSqlQuery q(d->db);
        q.setForwardOnly(true);
        if (!q.exec(stmt))
            return false;

        exists = q.next();
        newValues = q.record();
    }

    bool needsAddingToCache = !exists || d->cache.contains(row);

    if (!needsAddingToCache) {
        const QSqlRecord curValues = record(row);
        needsAddingToCache = curValues.count() != newValues.count();
        if (!needsAddingToCache) {
            // Look for changed values. Primary key fields are customarily first
            // and probably change less often than other fields, so start at the end.
            for (int f = curValues.count() - 1; f >= 0; --f) {
                if (curValues.value(f) != newValues.value(f)) {
                    needsAddingToCache = true;
                    break;
                }
            }
        }
    }

    if (needsAddingToCache) {
        d->cache[row].refresh(exists, newValues);
        emit headerDataChanged(Qt::Vertical, row, row);
        emit dataChanged(createIndex(row, 0), createIndex(row, columnCount() - 1));
    }

    return true;
}